

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

bool __thiscall
gl3cts::ClipDistance::CoverageTest::MaxClipDistancesValueTest(CoverageTest *this,Functions *gl)

{
  bool bVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  RenderContext *pRVar4;
  Enum<int,_2UL> EVar5;
  MessageBuilder local_368;
  ApiType local_1e4;
  ContextType local_1e0;
  int local_1dc;
  GetNameFunc p_Stack_1d8;
  GLint gl_max_clip_distances_minimum_value;
  int local_1d0;
  Enum<int,_2UL> local_1c8 [2];
  MessageBuilder local_1a8;
  GLenum local_24;
  Functions *pFStack_20;
  GLint error_code;
  Functions *gl_local;
  CoverageTest *this_local;
  
  local_24 = 0;
  pFStack_20 = gl;
  gl_local = (Functions *)this;
  (*gl->getIntegerv)(0xd32,&this->m_gl_max_clip_distances_value);
  local_24 = (*pFStack_20->getError)();
  if (local_24 == 0) {
    local_1dc = 6;
    pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    local_1e0.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
    glu::ApiType::ApiType(&local_1e4,3,1,PROFILE_CORE);
    bVar1 = glu::contextSupports(local_1e0,local_1e4);
    if (bVar1) {
      local_1dc = 8;
    }
    if (this->m_gl_max_clip_distances_value < local_1dc) {
      pTVar2 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_368,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_368,(char (*) [10])"Value of ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [22])"GL_MAX_CLIP_DISTANCES");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [13])0x29a9261);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_gl_max_clip_distances_value);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (pMVar3,(char (*) [39])" which is less than minimum required (");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1dc);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2c156ab);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_368);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [15])"glGetIntegerv(");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [22])"GL_MAX_CLIP_DISTANCES");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [23])0x299f912);
    EVar5 = glu::getErrorStr(local_24);
    p_Stack_1d8 = EVar5.m_getName;
    local_1d0 = EVar5.m_value;
    local_1c8[0].m_getName = p_Stack_1d8;
    local_1c8[0].m_value = local_1d0;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [25])" instead of GL_NO_ERROR.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool gl3cts::ClipDistance::CoverageTest::MaxClipDistancesValueTest(const glw::Functions& gl)
{
	/*  Check that calling GetIntegerv with GL_MAX_CLIP_DISTANCES doesn't
	 generate any errors and returns a value at least 6 in OpenGL 3.0
	 or 8 in OpenGL 3.1 and higher (see issues). */

	glw::GLint error_code = GL_NO_ERROR;

	gl.getIntegerv(GL_MAX_CLIP_DISTANCES, &m_gl_max_clip_distances_value);

	error_code = gl.getError();

	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv(" << STR(GL_MAX_CLIP_DISTANCES)
						   << ") returned error code " << glu::getErrorStr(error_code) << " instead of GL_NO_ERROR."
						   << tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		glw::GLint gl_max_clip_distances_minimum_value = 6; /* OpenGL 3.0 Specification minimum value */

		if (glu::contextSupports(
				m_context.getRenderContext().getType(),
				glu::ApiType(3, 1, glu::PROFILE_CORE))) /* OpenGL 3.1 Specification minimum value, see bug #4803 */
		{
			gl_max_clip_distances_minimum_value = 8;
		}

		if (m_gl_max_clip_distances_value < gl_max_clip_distances_minimum_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Value of " << STR(GL_MAX_CLIP_DISTANCES) << "is equal to "
							   << m_gl_max_clip_distances_value << " which is less than minimum required ("
							   << gl_max_clip_distances_minimum_value << ")." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}